

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManCutMatch(Nf_Man_t *p,int iObj)

{
  undefined1 *puVar1;
  Nf_Obj_t *pNVar2;
  float fVar3;
  Nf_Cfg_t NVar4;
  uint uVar5;
  Nf_Obj_t *pNVar6;
  float *pfVar7;
  int *piVar8;
  undefined1 auVar9 [16];
  uint *puVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  uint *pCutSet;
  int iVar15;
  Nf_Mat_t (*paNVar16) [2];
  int iVar17;
  int iVar18;
  bool bVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  uint *pCut;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  undefined8 uVar29;
  float fVar31;
  undefined1 auVar30 [16];
  float fVar32;
  float fVar33;
  int local_a4;
  
  if (iObj < 0) {
LAB_00787d89:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar26 = (ulong)(uint)iObj;
  uVar20 = iObj * 2;
  uVar11 = (p->vFlowRefs).nSize;
  if (((int)uVar11 <= (int)uVar20) || (uVar21 = uVar20 | 1, uVar11 <= uVar21)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
  }
  if ((p->vCutSets).nSize <= iObj) {
LAB_00787d6a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar11 = (p->vCutSets).pArray[uVar26];
  uVar13 = (int)uVar11 >> 0x10;
  if (((int)uVar13 < 0) || ((p->vPages).nSize <= (int)uVar13)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pNVar6 = p->pNfObjs;
  pNVar2 = pNVar6 + iObj;
  pfVar7 = (p->vFlowRefs).pArray;
  uVar24 = (ulong)uVar20;
  fVar31 = pfVar7[uVar24];
  fVar3 = pfVar7[uVar21];
  pCutSet = (uint *)((ulong)((uVar11 & 0xffff) << 2) + (long)(p->vPages).pArray[uVar13]);
  if (p->Iter == 0) {
    iVar18 = 0;
    local_a4 = 0;
  }
  else {
    uVar27 = 0;
    bVar28 = true;
    do {
      bVar19 = bVar28;
      uVar25 = uVar27 | uVar24;
      iVar18 = (p->vRequired).nSize;
      if (iVar18 <= (int)uVar25) goto LAB_00787d6a;
      piVar8 = (p->vRequired).pArray;
      if (piVar8[uVar25] == 0x3fffffff) {
        uVar11 = *(uint *)pNVar2->M[uVar27];
        uVar13 = uVar11 >> 0x14 & 0x3ff;
        if (uVar13 == 0) {
          __assert_fail("h > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x94,"int *Nf_CutFromHandle(int *, int)");
        }
        if ((pCutSet[uVar13] & 0x1f) == 0) {
          iVar14 = 0;
          iVar15 = 0;
        }
        else {
          NVar4 = pNVar2->M[uVar27][0].Cfg;
          bVar12 = 0;
          uVar27 = 0;
          iVar15 = 0;
          iVar14 = 0;
          do {
            uVar5 = pCutSet[(ulong)uVar13 + (ulong)(((uint)NVar4 >> 8) >> (bVar12 & 0x1f) & 0xf) + 1
                           ];
            if ((long)(int)uVar5 == 0) break;
            bVar28 = (((uint)NVar4 >> 1 & 0x7f) >> ((uint)uVar27 & 0x1f) & 1) != 0;
            if ((int)uVar5 < 0) goto LAB_00787d89;
            uVar22 = (uint)bVar28 + uVar5 * 2;
            if (iVar18 <= (int)uVar22) goto LAB_00787d6a;
            iVar23 = *(int *)((long)p->pCells->iDelays +
                             uVar27 * 4 + (ulong)((uVar11 & 0xfffff) * 0x50));
            iVar17 = pNVar6[(int)uVar5].M[bVar28][0].D + iVar23;
            if (iVar14 <= iVar17) {
              iVar14 = iVar17;
            }
            iVar23 = iVar23 + piVar8[uVar22];
            if (iVar23 < iVar15) {
              iVar23 = iVar15;
            }
            if (piVar8[uVar22] < 0x3fffffff) {
              iVar15 = iVar23;
            }
            uVar27 = uVar27 + 1;
            bVar12 = bVar12 + 4;
          } while (((ulong)pCutSet[uVar13] & 0x1f) != uVar27);
        }
        iVar15 = p->InvDelayI * p->pPars->nReqTimeFlex + iVar15;
        if (iVar15 <= iVar14) {
          iVar15 = iVar14;
        }
        piVar8[uVar25] = iVar15;
      }
      uVar27 = 1;
      bVar28 = false;
    } while (bVar19);
    iVar18 = (p->vRequired).nSize;
    if ((iVar18 <= (int)uVar20) || (iVar18 <= (int)uVar21)) goto LAB_00787d6a;
    iVar18 = piVar8[uVar24];
    local_a4 = piVar8[uVar21];
  }
  *(undefined8 *)pNVar2->M[0] = 0;
  pNVar2->M[0][0].D = 0;
  pNVar2->M[0][0].F = 0.0;
  *(undefined8 *)pNVar2->M[1] = 0;
  pNVar2->M[1][0].D = 0;
  pNVar2->M[1][0].F = 0.0;
  *(undefined8 *)(pNVar2->M[0] + 1) = 0;
  pNVar2->M[0][1].D = 0;
  pNVar2->M[0][1].F = 0.0;
  *(undefined8 *)(pNVar2->M[1] + 1) = 0;
  pNVar2->M[0][0].D = 0x3fffffff;
  pNVar2->M[0][0].F = 3.4028235e+38;
  pNVar2->M[1][0].D = 0x3fffffff;
  pNVar2->M[1][0].F = 3.4028235e+38;
  pNVar2->M[0][1].D = 0x3fffffff;
  pNVar2->M[0][1].F = 3.4028235e+38;
  pNVar2->M[1][1].D = 0x3fffffff;
  pNVar2->M[1][1].F = 3.4028235e+38;
  uVar11 = *pCutSet;
  if ((int)uVar11 < 1) {
    fVar32 = 3.4028235e+38;
    iVar14 = 0x3fffffff;
    iVar15 = 0x3fffffff;
    fVar33 = 3.4028235e+38;
    auVar30 = _DAT_00a3b9b0;
  }
  else {
    iVar15 = 0;
    puVar10 = pCutSet;
    do {
      pCut = puVar10 + 1;
      uVar20 = *pCut;
      if ((int)(uVar20 >> 6) < p->vTt2Match->nSize) {
        if (((uVar20 & 0x1f) == 1) && (puVar10[2] == iObj)) {
          __assert_fail("!Nf_CutIsTriv(pCut, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x4fa,"void Nf_ManCutMatch(Nf_Man_t *, int)");
        }
        if (p->pPars->nLutSize < (int)(uVar20 & 0x1f)) {
          __assert_fail("Nf_CutSize(pCut) <= p->pPars->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x4fb,"void Nf_ManCutMatch(Nf_Man_t *, int)");
        }
        Nf_ManCutMatchOne(p,iObj,(int *)pCut,(int *)pCutSet);
        uVar20 = *pCut;
        uVar11 = *pCutSet;
      }
      iVar15 = iVar15 + 1;
      puVar10 = pCut + (uVar20 & 0x1f);
    } while (iVar15 < (int)uVar11);
    fVar33 = pNVar2->M[0][0].F;
    fVar32 = pNVar2->M[1][0].F;
    iVar15 = pNVar2->M[0][0].D;
    iVar14 = pNVar2->M[1][0].D;
    auVar30._4_4_ = pNVar2->M[0][1].F;
    auVar30._0_4_ = pNVar2->M[1][1].F;
    auVar30._8_8_ = 0;
  }
  pNVar2->M[0][0].F = fVar33 / fVar31;
  auVar9._4_4_ = fVar31;
  auVar9._0_4_ = fVar3;
  auVar9._8_8_ = 0;
  auVar30 = divps(auVar30,auVar9);
  uVar29 = auVar30._0_8_;
  pNVar2->M[0][1].F = auVar30._4_4_;
  pNVar2->M[1][0].F = fVar32 / fVar3;
  pNVar2->M[1][1].F = auVar30._0_4_;
  if (0x3ffffffe < iVar14 && 0x3ffffffe < iVar15) {
    __assert_fail("pDp->D < SCL_INFINITY || pDn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x512,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  paNVar16 = pNVar6[iObj].M + 1;
  if (p->InvDelayI + iVar14 < iVar15) {
    NVar4 = ((Nf_Mat_t *)((long)paNVar16 + 0))->Cfg;
    iVar15 = pNVar6[iObj].M[1][0].D;
    fVar31 = pNVar6[iObj].M[1][0].F;
    *(undefined4 *)&pNVar2->M[0][0].field_0x0 =
         *(undefined4 *)&((Nf_Mat_t *)((long)paNVar16 + 0))->field_0x0;
    pNVar2->M[0][0].Cfg = NVar4;
    pNVar2->M[0][0].D = iVar15;
    pNVar2->M[0][0].F = fVar31;
    iVar15 = pNVar2->M[0][0].D + p->InvDelayI;
    pNVar2->M[0][0].D = iVar15;
    pNVar2->M[0][0].F = p->InvAreaF + pNVar2->M[0][0].F;
    puVar1 = &pNVar2->M[0][0].field_0x3;
    *puVar1 = *puVar1 | 0x40;
    iVar23 = pNVar2->M[0][1].D;
    if (iVar23 == 0x3fffffff) {
      NVar4 = pNVar2->M[0][0].Cfg;
      *(undefined4 *)&pNVar6[iObj].M[0][1].field_0x0 = *(undefined4 *)&pNVar2->M[0][0].field_0x0;
      pNVar6[iObj].M[0][1].Cfg = NVar4;
      pNVar6[iObj].M[0][1].D = pNVar2->M[0][0].D;
      pNVar6[iObj].M[0][1].F = pNVar2->M[0][0].F;
      goto LAB_00787b50;
    }
LAB_00787b6f:
    fVar31 = (float)((ulong)uVar29 >> 0x20);
    iVar17 = pNVar2->M[1][1].D;
    if (((float)uVar29 + p->InvAreaF + 0.001 < fVar31) && (p->InvDelayI + iVar17 <= iVar18))
    goto LAB_00787c0b;
    if ((iVar17 == 0x3fffffff) ||
       ((fVar31 + p->InvAreaF + 0.001 < (float)uVar29 && (iVar23 + p->InvDelayI <= local_a4)))) {
      if (p->Iter < 1) {
        __assert_fail("p->Iter > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x537,"void Nf_ManCutMatch(Nf_Man_t *, int)");
      }
      NVar4 = pNVar6[iObj].M[0][1].Cfg;
      iVar18 = pNVar6[iObj].M[0][1].D;
      fVar31 = pNVar6[iObj].M[0][1].F;
      *(undefined4 *)&pNVar6[iObj].M[1][1].field_0x0 =
           *(undefined4 *)&pNVar6[iObj].M[0][1].field_0x0;
      pNVar6[iObj].M[1][1].Cfg = NVar4;
      pNVar6[iObj].M[1][1].D = iVar18;
      pNVar6[iObj].M[1][1].F = fVar31;
      piVar8 = &pNVar2->M[1][1].D;
      *piVar8 = *piVar8 + p->InvDelayI;
      pNVar2->M[1][1].F = p->InvAreaF + pNVar2->M[1][1].F;
      puVar1 = &pNVar2->M[1][1].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      if (iVar14 == 0x3fffffff) {
        NVar4 = pNVar6[iObj].M[1][1].Cfg;
        iVar18 = pNVar6[iObj].M[1][1].D;
        fVar31 = pNVar6[iObj].M[1][1].F;
        *(undefined4 *)&((Nf_Mat_t *)((long)paNVar16 + 0))->field_0x0 =
             *(undefined4 *)&pNVar6[iObj].M[1][1].field_0x0;
        ((Nf_Mat_t *)((long)paNVar16 + 0))->Cfg = NVar4;
        pNVar6[iObj].M[1][0].D = iVar18;
        pNVar6[iObj].M[1][0].F = fVar31;
      }
    }
  }
  else {
    if (p->InvDelayI + iVar15 < iVar14) {
      NVar4 = pNVar2->M[0][0].Cfg;
      iVar14 = pNVar2->M[0][0].D;
      fVar31 = pNVar2->M[0][0].F;
      *(undefined4 *)&((Nf_Mat_t *)((long)paNVar16 + 0))->field_0x0 =
           *(undefined4 *)&pNVar2->M[0][0].field_0x0;
      ((Nf_Mat_t *)((long)paNVar16 + 0))->Cfg = NVar4;
      pNVar6[iObj].M[1][0].D = iVar14;
      pNVar6[iObj].M[1][0].F = fVar31;
      iVar23 = pNVar2->M[1][1].D;
      iVar14 = pNVar2->M[1][0].D + p->InvDelayI;
      pNVar2->M[1][0].D = iVar14;
      pNVar2->M[1][0].F = p->InvAreaF + pNVar2->M[1][0].F;
      puVar1 = &pNVar2->M[1][0].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      if (iVar23 == 0x3fffffff) {
        NVar4 = ((Nf_Mat_t *)((long)paNVar16 + 0))->Cfg;
        iVar23 = pNVar6[iObj].M[1][0].D;
        fVar31 = pNVar6[iObj].M[1][0].F;
        *(undefined4 *)&pNVar6[iObj].M[1][1].field_0x0 =
             *(undefined4 *)&((Nf_Mat_t *)((long)paNVar16 + 0))->field_0x0;
        pNVar6[iObj].M[1][1].Cfg = NVar4;
        pNVar6[iObj].M[1][1].D = iVar23;
        pNVar6[iObj].M[1][1].F = fVar31;
      }
    }
LAB_00787b50:
    iVar23 = pNVar2->M[0][1].D;
    if (iVar23 != 0x3fffffff) {
      uVar29 = CONCAT44(pNVar2->M[0][1].F,pNVar2->M[1][1].F);
      goto LAB_00787b6f;
    }
LAB_00787c0b:
    if (p->Iter < 1) {
      __assert_fail("p->Iter > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x52b,"void Nf_ManCutMatch(Nf_Man_t *, int)");
    }
    NVar4 = pNVar6[iObj].M[1][1].Cfg;
    iVar18 = pNVar6[iObj].M[1][1].D;
    fVar31 = pNVar6[iObj].M[1][1].F;
    *(undefined4 *)&pNVar6[iObj].M[0][1].field_0x0 = *(undefined4 *)&pNVar6[iObj].M[1][1].field_0x0;
    pNVar6[iObj].M[0][1].Cfg = NVar4;
    pNVar6[iObj].M[0][1].D = iVar18;
    pNVar6[iObj].M[0][1].F = fVar31;
    piVar8 = &pNVar2->M[0][1].D;
    *piVar8 = *piVar8 + p->InvDelayI;
    pNVar2->M[0][1].F = p->InvAreaF + pNVar2->M[0][1].F;
    puVar1 = &pNVar2->M[0][1].field_0x3;
    *puVar1 = *puVar1 | 0x40;
    if (iVar15 != 0x3fffffff) goto LAB_00787c9e;
    NVar4 = pNVar6[iObj].M[0][1].Cfg;
    iVar18 = pNVar6[iObj].M[0][1].D;
    fVar31 = pNVar6[iObj].M[0][1].F;
    *(undefined4 *)&pNVar2->M[0][0].field_0x0 = *(undefined4 *)&pNVar6[iObj].M[0][1].field_0x0;
    pNVar2->M[0][0].Cfg = NVar4;
    pNVar2->M[0][0].D = iVar18;
    pNVar2->M[0][0].F = fVar31;
    iVar15 = pNVar2->M[0][0].D;
  }
  if (iVar15 == 0x3fffffff) {
    printf("Object %d has pDp unassigned.\n",uVar26);
  }
LAB_00787c9e:
  if (pNVar2->M[1][0].D == 0x3fffffff) {
    printf("Object %d has pDn unassigned.\n",uVar26);
  }
  if (pNVar2->M[0][1].D == 0x3fffffff) {
    printf("Object %d has pAp unassigned.\n",uVar26);
  }
  if (pNVar2->M[1][1].D == 0x3fffffff) {
    printf("Object %d has pAn unassigned.\n",uVar26);
  }
  if (0x3ffffffe < pNVar2->M[0][0].D) {
    __assert_fail("pDp->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x54f,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < pNVar2->M[1][0].D) {
    __assert_fail("pDn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x550,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < pNVar2->M[0][1].D) {
    __assert_fail("pAp->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x551,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < pNVar2->M[1][1].D) {
    __assert_fail("pAn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x552,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar7 = &pNVar2->M[0][0].F;
  if (3.4028235e+38 < *pfVar7 || *pfVar7 == 3.4028235e+38) {
    __assert_fail("pDp->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x554,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar7 = &pNVar2->M[1][0].F;
  if (3.4028235e+38 < *pfVar7 || *pfVar7 == 3.4028235e+38) {
    __assert_fail("pDn->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x555,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar7 = &pNVar2->M[0][1].F;
  if (3.4028235e+38 < *pfVar7 || *pfVar7 == 3.4028235e+38) {
    __assert_fail("pAp->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x556,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar7 = &pNVar2->M[1][1].F;
  if (3.4028235e+38 < *pfVar7 || *pfVar7 == 3.4028235e+38) {
    __assert_fail("pAn->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x557,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  return;
}

Assistant:

void Nf_ManCutMatch( Nf_Man_t * p, int iObj )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    Nf_Mat_t * pDp = &pBest->M[0][0];
    Nf_Mat_t * pDn = &pBest->M[1][0];
    Nf_Mat_t * pAp = &pBest->M[0][1];
    Nf_Mat_t * pAn = &pBest->M[1][1];
    float FlowRefPf  = Nf_ObjFlowRefs(p, iObj, 0);
    float FlowRefNf  = Nf_ObjFlowRefs(p, iObj, 1);
    int i, * pCut, * pCutSet = Nf_ObjCutSet( p, iObj );
    int Required[2] = {0};
    if ( p->Iter )
    {
        Nf_ObjComputeRequired( p, iObj );
        Required[0] = Nf_ObjRequired( p, iObj, 0 );
        Required[1] = Nf_ObjRequired( p, iObj, 1 );
    }
    memset( pBest, 0, sizeof(Nf_Obj_t) );
    pDp->D = SCL_INFINITY; pDp->F = FLT_MAX;
    pDn->D = SCL_INFINITY; pDn->F = FLT_MAX;
    pAp->D = SCL_INFINITY; pAp->F = FLT_MAX;
    pAn->D = SCL_INFINITY; pAn->F = FLT_MAX;
    Nf_SetForEachCut( pCutSet, pCut, i )
    {
        if ( Abc_Lit2Var(Nf_CutFunc(pCut)) >= Vec_WecSize(p->vTt2Match) )
            continue;
        assert( !Nf_CutIsTriv(pCut, iObj) );
        assert( Nf_CutSize(pCut) <= p->pPars->nLutSize );
        assert( Abc_Lit2Var(Nf_CutFunc(pCut)) < Vec_WecSize(p->vTt2Match) );
        Nf_ManCutMatchOne( p, iObj, pCut, pCutSet );
    }

/*
    if ( 461 == iObj && p->Iter == 0 )
    {
        printf( "\nObj %6d (%.2f %.2f):\n", iObj, Scl_Int2Flt(Required[0]), Scl_Int2Flt(Required[1]) );
        Nf_ManCutMatchPrint( p, iObj, "Dp", &pBest->M[0][0] );
        Nf_ManCutMatchPrint( p, iObj, "Dn", &pBest->M[1][0] );
        Nf_ManCutMatchPrint( p, iObj, "Ap", &pBest->M[0][1] );
        Nf_ManCutMatchPrint( p, iObj, "An", &pBest->M[1][1] );
        printf( "\n" );
    }
*/
    // divide by ref count
    pDp->F = pDp->F / FlowRefPf;
    pAp->F = pAp->F / FlowRefPf;
    pDn->F = pDn->F / FlowRefNf;
    pAn->F = pAn->F / FlowRefNf;

    // add the inverters
    assert( pDp->D < SCL_INFINITY || pDn->D < SCL_INFINITY );
    if ( pDp->D > pDn->D + p->InvDelayI )
    {
        *pDp = *pDn;
        pDp->D += p->InvDelayI;
        pDp->F += p->InvAreaF;
        pDp->fCompl = 1;
        if ( pAp->D == SCL_INFINITY )
            *pAp = *pDp;
        //printf( "Using inverter to improve delay at node %d in phase %d.\n", iObj, 1 );
    }
    else if ( pDn->D > pDp->D + p->InvDelayI )
    {
        *pDn = *pDp;
        pDn->D += p->InvDelayI;
        pDn->F += p->InvAreaF;
        pDn->fCompl = 1;
        if ( pAn->D == SCL_INFINITY )
            *pAn = *pDn;
        //printf( "Using inverter to improve delay at node %d in phase %d.\n", iObj, 0 );
    }
    //assert( pAp->F < FLT_MAX || pAn->F < FLT_MAX );
    // try replacing pos with neg
    if ( pAp->D == SCL_INFINITY || (pAp->F > pAn->F + p->InvAreaF + NF_EPSILON && pAn->D + p->InvDelayI <= Required[0]) )
    {
        assert( p->Iter > 0 );
        *pAp = *pAn;
        pAp->D += p->InvDelayI;
        pAp->F += p->InvAreaF;
        pAp->fCompl = 1;
        if ( pDp->D == SCL_INFINITY )
            *pDp = *pAp;
        //printf( "Using inverter to improve area at node %d in phase %d.\n", iObj, 1 );
    }
    // try replacing neg with pos
    else if ( pAn->D == SCL_INFINITY || (pAn->F > pAp->F + p->InvAreaF + NF_EPSILON && pAp->D + p->InvDelayI <= Required[1]) )
    {
        assert( p->Iter > 0 );
        *pAn = *pAp;
        pAn->D += p->InvDelayI;
        pAn->F += p->InvAreaF;
        pAn->fCompl = 1;
        if ( pDn->D == SCL_INFINITY )
            *pDn = *pAn;
        //printf( "Using inverter to improve area at node %d in phase %d.\n", iObj, 0 );
    }

    if ( pDp->D == SCL_INFINITY )
        printf( "Object %d has pDp unassigned.\n", iObj );
    if ( pDn->D == SCL_INFINITY )
        printf( "Object %d has pDn unassigned.\n", iObj );
    if ( pAp->D == SCL_INFINITY )
        printf( "Object %d has pAp unassigned.\n", iObj );
    if ( pAn->D == SCL_INFINITY )
        printf( "Object %d has pAn unassigned.\n", iObj );
/*
    pDp->F = Abc_MinFloat( pDp->F, FLT_MAX/SCL_NUM );
    pDn->F = Abc_MinFloat( pDn->F, FLT_MAX/SCL_NUM );
    pAp->F = Abc_MinFloat( pAp->F, FLT_MAX/SCL_NUM );  
    pAn->F = Abc_MinFloat( pAn->F, FLT_MAX/SCL_NUM );
*/    
    assert( pDp->D < SCL_INFINITY );
    assert( pDn->D < SCL_INFINITY );
    assert( pAp->D < SCL_INFINITY );
    assert( pAn->D < SCL_INFINITY );

    assert( pDp->F < FLT_MAX );
    assert( pDn->F < FLT_MAX );
    assert( pAp->F < FLT_MAX );
    assert( pAn->F < FLT_MAX );

/*
    if ( p->Iter && (pDp->D > Required[0] || pDn->D > Required[1]) )
    {
        printf( "%5d : ", iObj );
        printf( "Dp = %6.2f  ", Scl_Int2Flt(pDp->D) );
        printf( "Dn = %6.2f  ", Scl_Int2Flt(pDn->D) );
        printf( "  " );
        printf( "Ap = %6.2f  ", Scl_Int2Flt(pAp->D) );
        printf( "An = %6.2f  ", Scl_Int2Flt(pAn->D) );
        printf( "  " );
        printf( "Rp = %6.2f  ", Scl_Int2Flt(Required[0]) );
        printf( "Rn = %6.2f  ", Scl_Int2Flt(Required[1]) );
        printf( "\n" );
    }
*/
}